

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O2

int cmac_test_subkeys(int verbose,char *testname,uchar *key,int keybits,uchar *subkeys,
                     mbedtls_cipher_type_t cipher_type,int block_size,int num_tests)

{
  int iVar1;
  mbedtls_cipher_info_t *cipher_info;
  uint uVar2;
  char *__s;
  ulong __n;
  uchar K2 [16];
  uchar K1 [16];
  mbedtls_cipher_context_t ctx;
  
  cipher_info = mbedtls_cipher_info_from_type(cipher_type);
  if (cipher_info == (mbedtls_cipher_info_t *)0x0) {
    iVar1 = -0x6080;
  }
  else {
    __n = (ulong)(uint)block_size;
    for (uVar2 = 1; uVar2 != 5; uVar2 = uVar2 + 1) {
      if (verbose != 0) {
        printf("  %s CMAC subkey #%u: ",testname,(ulong)uVar2);
      }
      mbedtls_cipher_init(&ctx);
      iVar1 = mbedtls_cipher_setup(&ctx,cipher_info);
      if ((iVar1 != 0) ||
         (iVar1 = mbedtls_cipher_setkey(&ctx,key,keybits,MBEDTLS_ENCRYPT), iVar1 != 0)) {
        if (verbose == 0) goto LAB_00123d10;
        __s = "test execution failed";
LAB_00123d0b:
        puts(__s);
LAB_00123d10:
        mbedtls_cipher_free(&ctx);
        return iVar1;
      }
      iVar1 = cmac_generate_subkeys(&ctx,K1,K2);
      if (((iVar1 != 0) || (iVar1 = memcmp(K1,subkeys,__n), iVar1 != 0)) ||
         (iVar1 = memcmp(K2,subkeys + __n,__n), iVar1 != 0)) {
        if (verbose == 0) goto LAB_00123d10;
        __s = "failed";
        goto LAB_00123d0b;
      }
      if (verbose != 0) {
        puts("passed");
      }
      mbedtls_cipher_free(&ctx);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int cmac_test_subkeys( int verbose,
                              const char* testname,
                              const unsigned char* key,
                              int keybits,
                              const unsigned char* subkeys,
                              mbedtls_cipher_type_t cipher_type,
                              int block_size,
                              int num_tests )
{
    int i, ret = 0;
    mbedtls_cipher_context_t ctx;
    const mbedtls_cipher_info_t *cipher_info;
    unsigned char K1[MBEDTLS_CIPHER_BLKSIZE_MAX];
    unsigned char K2[MBEDTLS_CIPHER_BLKSIZE_MAX];

    cipher_info = mbedtls_cipher_info_from_type( cipher_type );
    if( cipher_info == NULL )
    {
        /* Failing at this point must be due to a build issue */
        return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
    }

    for( i = 0; i < num_tests; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  %s CMAC subkey #%u: ", testname, i + 1 );

        mbedtls_cipher_init( &ctx );

        if( ( ret = mbedtls_cipher_setup( &ctx, cipher_info ) ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "test execution failed\n" );

            goto cleanup;
        }

        if( ( ret = mbedtls_cipher_setkey( &ctx, key, keybits,
                                       MBEDTLS_ENCRYPT ) ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "test execution failed\n" );

            goto cleanup;
        }

        ret = cmac_generate_subkeys( &ctx, K1, K2 );
        if( ret != 0 )
        {
           if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            goto cleanup;
        }

        if( ( ret = memcmp( K1, subkeys, block_size ) ) != 0  ||
            ( ret = memcmp( K2, &subkeys[block_size], block_size ) ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            goto cleanup;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );

        mbedtls_cipher_free( &ctx );
    }

    ret = 0;
    goto exit;

cleanup:
    mbedtls_cipher_free( &ctx );

exit:
    return( ret );
}